

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageChannel.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TypedFlatImageChannel<Imath_3_2::half>::resize
          (TypedFlatImageChannel<Imath_3_2::half> *this)

{
  size_t sVar1;
  half *__s;
  ulong uVar2;
  
  if (this->_pixels != (half *)0x0) {
    operator_delete__(this->_pixels);
  }
  this->_pixels = (half *)0x0;
  ImageChannel::resize((ImageChannel *)this);
  sVar1 = (this->super_FlatImageChannel).super_ImageChannel._numPixels;
  uVar2 = 0xffffffffffffffff;
  if (-1 < (long)sVar1) {
    uVar2 = sVar1 * 2;
  }
  __s = (half *)operator_new__(uVar2);
  this->_pixels = __s;
  if (sVar1 != 0) {
    memset(__s,0,sVar1 * 2);
  }
  (*(this->super_FlatImageChannel).super_ImageChannel._vptr_ImageChannel[5])(this);
  return;
}

Assistant:

void
TypedFlatImageChannel<T>::resize ()
{
    delete[] _pixels;
    _pixels = 0;

    FlatImageChannel::resize (); // may throw an exception

    _pixels = new T[numPixels ()];

    for (size_t i = 0; i < numPixels (); ++i)
        _pixels[i] = T (0);

    resetBasePointer ();
}